

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O1

bool __thiscall
cs::domain_type::add_var_optimal(domain_type *this,var_id *id,var *val,bool override)

{
  if ((id->m_ref).super___shared_ptr<cs::domain_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (this->m_ref).super___shared_ptr<cs::domain_ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
    if (this->optimize == true) {
      cs_impl::any::operator=
                ((this->m_slot).super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>.
                 _M_impl.super__Vector_impl_data._M_start + id->m_slot_id,val);
      return true;
    }
    if (!override) {
      return false;
    }
  }
  add_var(this,id,val);
  return true;
}

Assistant:

bool add_var_optimal(const var_id &id, const var &val, bool override = false)
		{
			if (id.m_ref == m_ref) {
				if (optimize) {
					m_slot[id.m_slot_id] = val;
					return true;
				}
				else if (override) {
					add_var(id, val);
					return true;
				}
				else
					return false;
			}
			else {
				add_var(id, val);
				return true;
			}
		}